

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O3

void ReadFilesIntoMemory(void)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  XMLCh *pXVar4;
  FILE *__stream;
  size_t sVar5;
  char *__ptr;
  size_t sVar6;
  undefined8 extraout_RAX;
  ThreadParser *this;
  InFileInfo *pIVar7;
  int fileNum;
  DOMDocument *node;
  long lVar8;
  double dVar9;
  undefined8 uVar10;
  
  if ((gRunInfo.inMemory) && (0 < gRunInfo.numInputFiles)) {
    pIVar7 = gRunInfo.files;
    lVar8 = 0;
    do {
      pXVar4 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                  (pIVar7->fileName,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pIVar7->uFileName = pXVar4;
      __stream = fopen64(pIVar7->fileName,"rb");
      if (__stream == (FILE *)0x0) {
        ReadFilesIntoMemory();
LAB_00105b2b:
        ReadFilesIntoMemory();
        uVar10 = extraout_RAX;
        if (gRunInfo.verbose == true) {
          printf("Thread #%d: starting\n",(ulong)*(uint *)&pIVar7->uFileName);
        }
        if (gRunInfo.stopNow != false) goto LAB_00105b65;
        this = (ThreadParser *)0x0;
        fileNum = gRunInfo.numInputFiles;
        do {
          if ((gRunInfo.numParses == 0) ||
             (*(uint *)((long)&pIVar7->fileName + 4) < gRunInfo.numParses)) {
            *(undefined1 *)((long)&pIVar7->fileName + 1) = 1;
            if (this == (ThreadParser *)0x0) {
              this = (ThreadParser *)operator_new(0x40);
              ThreadParser::ThreadParser(this);
            }
            fileNum = fileNum + 1;
            if (gRunInfo.numInputFiles <= fileNum) {
              fileNum = 0;
            }
            if (gRunInfo.verbose == true) {
              printf("Thread #%d: parse %d starting file %s\n",(ulong)*(uint *)&pIVar7->uFileName,
                     (ulong)*(uint *)((long)&pIVar7->fileName + 4),gRunInfo.files[fileNum].fileName)
              ;
            }
            uVar3 = ThreadParser::parse(this,fileNum);
            uVar2 = gRunInfo.files[fileNum].checkSum;
            if (uVar2 == 0) {
              gRunInfo.files[fileNum].checkSum = uVar3;
            }
            else if (uVar3 != uVar2) {
              if (uVar3 == 0) {
                uVar3 = this->fCheckSum;
              }
              fprintf(_stderr,
                      "\nThread %d: Parse Check sum error on file  \"%s\" for parse # %d.  Expected %x,  got %x\n"
                      ,(ulong)*(uint *)&pIVar7->uFileName,gRunInfo.files[fileNum].fileName,
                      (ulong)*(uint *)((long)&pIVar7->fileName + 4),(ulong)uVar2,
                      CONCAT44((int)((ulong)uVar10 >> 0x20),uVar3));
              dVar9 = 0.0;
              if (0 < (long)gRunInfo.numThreads) {
                lVar8 = 0;
                do {
                  dVar9 = dVar9 + (double)*(uint *)((long)&gThreadInfo->fParses + lVar8);
                  lVar8 = lVar8 + 0xc;
                } while ((long)gRunInfo.numThreads * 0xc != lVar8);
              }
              fprintf(_stderr,"Total number of parses completed is %f.\n",dVar9);
              if (gRunInfo.dom == true) {
                this->fCheckSum = 0;
                node = this->fDoc + 0x18;
                if (this->fDoc == (DOMDocument *)0x0) {
                  node = (DOMDocument *)0x0;
                }
                ThreadParser::domCheckSum(this,(DOMNode *)node);
              }
              fprintf(_stderr,"   Retry checksum is %x\n",(ulong)(uint)this->fCheckSum);
              if ((gRunInfo.dumpOnErr != false) && (gRunInfo.dom == true)) {
                ThreadParser::domPrint(this);
              }
              fflush(_stdout);
              fflush(_stderr);
              clearFileInfoMemory();
              exit(-1);
            }
            if (gRunInfo.reuseParser == false) {
              ThreadParser::~ThreadParser(this);
              operator_delete(this,0x40);
              this = (ThreadParser *)0x0;
            }
            *(undefined2 *)&pIVar7->fileName = 1;
            piVar1 = (int *)((long)&pIVar7->fileName + 4);
            *piVar1 = *piVar1 + 1;
          }
          else {
            sleep(1);
          }
        } while (gRunInfo.stopNow == false);
        if (this == (ThreadParser *)0x0) {
LAB_00105b65:
          this = (ThreadParser *)0x0;
        }
        else {
          ThreadParser::~ThreadParser(this);
        }
        operator_delete(this,0x40);
        return;
      }
      fseek(__stream,0,2);
      sVar5 = ftell(__stream);
      pIVar7->fileSize = sVar5;
      fseek(__stream,0,0);
      sVar6 = pIVar7->fileSize;
      __ptr = (char *)operator_new__(sVar6 + 1);
      pIVar7->fileContent = __ptr;
      sVar6 = fread(__ptr,1,sVar6,__stream);
      if (sVar6 != pIVar7->fileSize) goto LAB_00105b2b;
      fclose(__stream);
      pIVar7->fileContent[pIVar7->fileSize] = '\0';
      lVar8 = lVar8 + 1;
      pIVar7 = pIVar7 + 1;
    } while (lVar8 < gRunInfo.numInputFiles);
  }
  return;
}

Assistant:

void ReadFilesIntoMemory()
{
    int     fileNum;
    FILE    *fileF;
    size_t  t;

    if (gRunInfo.inMemory)
    {
        for (fileNum = 0; fileNum <gRunInfo.numInputFiles; fileNum++)
        {
            InFileInfo *fInfo = &gRunInfo.files[fileNum];
            fInfo->uFileName = XMLString::transcode(fInfo->fileName);
            fileF = fopen( fInfo->fileName, "rb" );
            if (fileF == 0) {
                fprintf(stderr, "Can not open file \"%s\".\n", fInfo->fileName);
                clearFileInfoMemory();
                exit(-1);
            }
            fseek(fileF, 0, SEEK_END);
            fInfo->fileSize = ftell(fileF);
            fseek(fileF, 0, SEEK_SET);
            fInfo->fileContent = new char[fInfo->fileSize + 1];
            t = fread(fInfo->fileContent, 1, fInfo->fileSize, fileF);
            if (t != fInfo->fileSize) {
                fprintf(stderr, "Error reading file \"%s\".\n", fInfo->fileName);
                clearFileInfoMemory();
                exit(-1);
            }
            fclose(fileF);
            fInfo->fileContent[fInfo->fileSize] = 0;
        }
    }
}